

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Animation::Animation(Animation *this,Animation *param_1)

{
  Animation *param_1_local;
  Animation *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::vector<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>::vector
            (&this->channels,&param_1->channels);
  std::vector<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>::vector
            (&this->samplers,&param_1->samplers);
  Value::Value(&this->extras,&param_1->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Animation() = default;